

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall olc::Sprite::LoadFromPGESprFile(Sprite *this,string *sImageFile,ResourcePack *pack)

{
  char cVar1;
  rcode rVar2;
  anon_class_8_1_8991fb9c ReadData;
  ResourceBuffer rb;
  istream is;
  
  if (this->pColData != (Pixel *)0x0) {
    operator_delete__(this->pColData);
  }
  ReadData.this = this;
  if (pack == (ResourcePack *)0x0) {
    std::ifstream::ifstream((string *)&is);
    std::ifstream::open((string *)&is,(_Ios_Openmode)sImageFile);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      LoadFromPGESprFile::anon_class_8_1_8991fb9c::operator()(&ReadData,&is);
    }
    rVar2 = (rcode)(cVar1 != '\0');
    std::ifstream::~ifstream(&is);
  }
  else {
    ResourcePack::GetFileBuffer(&rb,pack,sImageFile);
    std::istream::istream(&is,&rb.super_streambuf);
    LoadFromPGESprFile::anon_class_8_1_8991fb9c::operator()(&ReadData,&is);
    std::istream::~istream(&is);
    ResourceBuffer::~ResourceBuffer(&rb);
    rVar2 = OK;
  }
  return rVar2;
}

Assistant:

olc::rcode Sprite::LoadFromPGESprFile(const std::string& sImageFile, olc::ResourcePack* pack)
	{
		if (pColData) delete[] pColData;
		auto ReadData = [&](std::istream& is)
		{
			is.read((char*)&width, sizeof(int32_t));
			is.read((char*)&height, sizeof(int32_t));
			pColData = new Pixel[width * height];
			is.read((char*)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
		};

		// These are essentially Memory Surfaces represented by olc::Sprite
		// which load very fast, but are completely uncompressed
		if (pack == nullptr)
		{
			std::ifstream ifs;
			ifs.open(sImageFile, std::ifstream::binary);
			if (ifs.is_open())
			{
				ReadData(ifs);
				return olc::OK;
			}
			else
				return olc::FAIL;
		}
		else
		{
			ResourceBuffer rb = pack->GetFileBuffer(sImageFile);
			std::istream is(&rb);
			ReadData(is);
			return olc::OK;
		}
		return olc::FAIL;
	}